

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O0

void helper_ltr_x86_64(CPUX86State *env,int selector)

{
  int iVar1;
  uint32_t e1_00;
  uint32_t e2_00;
  uint uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  abi_ptr addr;
  uintptr_t unaff_retaddr;
  uint32_t e4;
  uint32_t e3;
  target_ulong ptr;
  int entry_limit;
  int type;
  int index;
  uint32_t e2;
  uint32_t e1;
  SegmentCache *dt;
  int selector_local;
  CPUX86State *env_local;
  
  if ((selector & 0xfffcU) == 0) {
    (env->tr).base = 0;
    (env->tr).limit = 0;
    (env->tr).flags = 0;
  }
  else {
    if ((selector & 4U) != 0) {
      raise_exception_err_ra_x86_64(env,0xd,selector & 0xfffc,unaff_retaddr);
    }
    if ((env->hflags & 0x4000) == 0) {
      ptr._4_4_ = 7;
    }
    else {
      ptr._4_4_ = 0xf;
    }
    if ((env->gdt).limit < (selector & 0xfff8U) + ptr._4_4_) {
      raise_exception_err_ra_x86_64(env,0xd,selector & 0xfffc,unaff_retaddr);
    }
    addr = (env->gdt).base + (long)(int)(selector & 0xfff8U);
    iVar1 = cpu_mmu_index_kernel(env);
    e1_00 = cpu_ldl_mmuidx_ra_x86_64(env,addr,iVar1,unaff_retaddr);
    iVar1 = cpu_mmu_index_kernel(env);
    e2_00 = cpu_ldl_mmuidx_ra_x86_64(env,addr + 4,iVar1,unaff_retaddr);
    uVar2 = e2_00 >> 8 & 0xf;
    if (((e2_00 & 0x1000) != 0) || ((uVar2 != 1 && (uVar2 != 9)))) {
      raise_exception_err_ra_x86_64(env,0xd,selector & 0xfffc,unaff_retaddr);
    }
    if ((e2_00 & 0x8000) == 0) {
      raise_exception_err_ra_x86_64(env,0xb,selector & 0xfffc,unaff_retaddr);
    }
    if ((env->hflags & 0x4000) == 0) {
      load_seg_cache_raw_dt(&env->tr,e1_00,e2_00);
    }
    else {
      iVar1 = cpu_mmu_index_kernel(env);
      uVar3 = cpu_ldl_mmuidx_ra_x86_64(env,addr + 8,iVar1,unaff_retaddr);
      iVar1 = cpu_mmu_index_kernel(env);
      uVar4 = cpu_ldl_mmuidx_ra_x86_64(env,addr + 0xc,iVar1,unaff_retaddr);
      if ((uVar4 >> 8 & 0xf) != 0) {
        raise_exception_err_ra_x86_64(env,0xd,selector & 0xfffc,unaff_retaddr);
      }
      load_seg_cache_raw_dt(&env->tr,e1_00,e2_00);
      (env->tr).base = (ulong)uVar3 << 0x20 | (env->tr).base;
    }
    iVar1 = cpu_mmu_index_kernel(env);
    cpu_stl_mmuidx_ra_x86_64(env,addr + 4,e2_00 | 0x200,iVar1,unaff_retaddr);
  }
  (env->tr).selector = selector & 0xffff;
  return;
}

Assistant:

void helper_ltr(CPUX86State *env, int selector)
{
    SegmentCache *dt;
    uint32_t e1, e2;
    int index, type, entry_limit;
    target_ulong ptr;

    selector &= 0xffff;
    if ((selector & 0xfffc) == 0) {
        /* NULL selector case: invalid TR */
        env->tr.base = 0;
        env->tr.limit = 0;
        env->tr.flags = 0;
    } else {
        if (selector & 0x4) {
            raise_exception_err_ra(env, EXCP0D_GPF, selector & 0xfffc, GETPC());
        }
        dt = &env->gdt;
        index = selector & ~7;
#ifdef TARGET_X86_64
        if (env->hflags & HF_LMA_MASK) {
            entry_limit = 15;
        } else
#endif
        {
            entry_limit = 7;
        }
        if ((index + entry_limit) > dt->limit) {
            raise_exception_err_ra(env, EXCP0D_GPF, selector & 0xfffc, GETPC());
        }
        ptr = dt->base + index;
        e1 = cpu_ldl_kernel_ra(env, ptr, GETPC());
        e2 = cpu_ldl_kernel_ra(env, ptr + 4, GETPC());
        type = (e2 >> DESC_TYPE_SHIFT) & 0xf;
        if ((e2 & DESC_S_MASK) ||
            (type != 1 && type != 9)) {
            raise_exception_err_ra(env, EXCP0D_GPF, selector & 0xfffc, GETPC());
        }
        if (!(e2 & DESC_P_MASK)) {
            raise_exception_err_ra(env, EXCP0B_NOSEG, selector & 0xfffc, GETPC());
        }
#ifdef TARGET_X86_64
        if (env->hflags & HF_LMA_MASK) {
            uint32_t e3, e4;

            e3 = cpu_ldl_kernel_ra(env, ptr + 8, GETPC());
            e4 = cpu_ldl_kernel_ra(env, ptr + 12, GETPC());
            if ((e4 >> DESC_TYPE_SHIFT) & 0xf) {
                raise_exception_err_ra(env, EXCP0D_GPF, selector & 0xfffc, GETPC());
            }
            load_seg_cache_raw_dt(&env->tr, e1, e2);
            env->tr.base |= (target_ulong)e3 << 32;
        } else
#endif
        {
            load_seg_cache_raw_dt(&env->tr, e1, e2);
        }
        e2 |= DESC_TSS_BUSY_MASK;
        cpu_stl_kernel_ra(env, ptr + 4, e2, GETPC());
    }
    env->tr.selector = selector;
}